

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFunctionLibrary.cpp
# Opt level: O0

void __thiscall
tcu::StaticFunctionLibrary::StaticFunctionLibrary
          (StaticFunctionLibrary *this,Entry *entries,int numEntries)

{
  char *__s;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)()>
  local_48;
  int local_20;
  int local_1c;
  int entryNdx;
  int numEntries_local;
  Entry *entries_local;
  StaticFunctionLibrary *this_local;
  
  local_1c = numEntries;
  _entryNdx = entries;
  entries_local = (Entry *)this;
  FunctionLibrary::FunctionLibrary(&this->super_FunctionLibrary);
  (this->super_FunctionLibrary)._vptr_FunctionLibrary =
       (_func_int **)&PTR__StaticFunctionLibrary_032dcb98;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)()>_>_>
  ::map(&this->m_functions);
  for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
    __s = _entryNdx[local_20].name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,__s,&local_69);
    std::make_pair<std::__cxx11::string,void(*const&)()>
              (&local_48,&local_68,&_entryNdx[local_20].ptr);
    std::
    map<std::__cxx11::string,void(*)(),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)()>>>
    ::insert<std::pair<std::__cxx11::string,void(*)()>>
              ((map<std::__cxx11::string,void(*)(),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)()>>>
                *)&this->m_functions,&local_48);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)()>
    ::~pair(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
  }
  return;
}

Assistant:

StaticFunctionLibrary::StaticFunctionLibrary (const Entry* entries, int numEntries)
{
	for (int entryNdx = 0; entryNdx < numEntries; entryNdx++)
		m_functions.insert(std::make_pair(std::string(entries[entryNdx].name), entries[entryNdx].ptr));
}